

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O2

int open_serialport(char *dev,int baudrate)

{
  int __fd;
  speed_t __speed;
  termios options;
  
  __fd = open(dev,0x102);
  if (__fd == -1) {
    return -1;
  }
  if (baudrate == 600) {
    __speed = 8;
  }
  else if (baudrate == 0x4b0) {
    __speed = 9;
  }
  else if (baudrate == 0x4b00) {
    __speed = 0xe;
  }
  else if (baudrate == 0x9600) {
    __speed = 0xf;
  }
  else if (baudrate == 0xe100) {
    __speed = 0x1001;
  }
  else if (baudrate == 0x1c200) {
    __speed = 0x1002;
  }
  else if (baudrate == 0x38400) {
    __speed = 0x1003;
  }
  else {
    if (baudrate != 0x70800) {
      if (baudrate == 0xe1000) {
        __speed = 0x1007;
        goto LAB_001029c2;
      }
      if (baudrate == 1000000) {
        __speed = 0x1008;
        goto LAB_001029c2;
      }
      if (baudrate == 1500000) {
        __speed = 0x100a;
        goto LAB_001029c2;
      }
      if (baudrate == 2000000) {
        __speed = 0x100b;
        goto LAB_001029c2;
      }
      if (baudrate == 4000000) {
        __speed = 0x100f;
        goto LAB_001029c2;
      }
      if (baudrate == 3000000) {
        __speed = 0x100d;
        goto LAB_001029c2;
      }
    }
    __speed = 0x1004;
  }
LAB_001029c2:
  if (((byte)loglevel & 8) != 0) {
    syslog(7,"serial opened\n");
  }
  tcgetattr(__fd,(termios *)&options);
  cfsetispeed((termios *)&options,__speed);
  cfsetospeed((termios *)&options,__speed);
  cfmakeraw((termios *)&options);
  options.c_cc[5] = '\x01';
  options.c_cc[6] = '\0';
  tcsetattr(__fd,0,(termios *)&options);
  return __fd;
}

Assistant:

int open_serialport(const char *dev, int baudrate)
{
    int fd;

    fd = open(dev, O_RDWR | O_NOCTTY /*| O_NDELAY*/);
    if (fd != -1) {
        struct termios options;
        speed_t baud = tcio_baud(baudrate);
        LOGD("serial opened\n" );
        // The old way. Let's not change baud settings
        // fcntl(fd, F_SETFL, 0);

        // get the parameters
        tcgetattr(fd, &options);

        cfsetispeed(&options, baud);
        cfsetospeed(&options, baud);

        cfmakeraw(&options);

        //options.c_cflag |= (IXON | IXOFF);
        options.c_cc[VTIME] = 1;
        options.c_cc[VMIN]  = 0;

        // Set the new options for the port...
        tcsetattr(fd, TCSANOW, &options);
    }
    return fd;
}